

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O3

bool __thiscall
miniros::ServiceManager::advertiseService(ServiceManager *this,AdvertiseServiceOptions *ops)

{
  mutex *__mutex;
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  MasterLink *this_00;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  _Node *p_Var7;
  string *psVar8;
  XmlRpcValue *pXVar9;
  size_t sVar10;
  string local_498;
  XmlRpcValue args;
  XmlRpcValue payload;
  XmlRpcValue result;
  XmlRpcValue local_448;
  char uri_buf [1024];
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->shutting_down_mutex_);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  if ((this->shutting_down_ == false) &&
     ((this->master_link_).super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0)) {
    __mutex = &this->service_publications_mutex_;
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar5 != 0) {
      std::__throw_system_error(iVar5);
    }
    bVar4 = isServiceAdvertised(this,&ops->service);
    if (!bVar4) {
      std::__shared_ptr<miniros::ServicePublication,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<miniros::ServicePublication>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::shared_ptr<miniros::ServiceCallbackHelper>const&,miniros::CallbackQueueInterface*const&,std::shared_ptr<void_const>const&>
                ((__shared_ptr<miniros::ServicePublication,(__gnu_cxx::_Lock_policy)2> *)uri_buf,
                 (allocator<miniros::ServicePublication> *)&local_498,&ops->service,&ops->md5sum,
                 &ops->datatype,&ops->req_datatype,&ops->res_datatype,&ops->helper,
                 &ops->callback_queue,&ops->tracked_object);
      p_Var7 = std::__cxx11::
               list<std::shared_ptr<miniros::ServicePublication>,std::allocator<std::shared_ptr<miniros::ServicePublication>>>
               ::_M_create_node<std::shared_ptr<miniros::ServicePublication>const&>
                         ((list<std::shared_ptr<miniros::ServicePublication>,std::allocator<std::shared_ptr<miniros::ServicePublication>>>
                           *)this,(shared_ptr<miniros::ServicePublication> *)uri_buf);
      std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
      psVar1 = &(this->service_publications_).
                super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (uri_buf._8_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uri_buf._8_8_);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      args._type = TypeInvalid;
      args._value.asDouble = 0.0;
      result._type = TypeInvalid;
      result._value.asDouble = 0.0;
      payload._type = TypeInvalid;
      payload._value.asDouble = 0.0;
      psVar8 = this_node::getName_abi_cxx11_();
      XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)uri_buf,psVar8);
      pXVar9 = XmlRpc::XmlRpcValue::operator[](&args,0);
      XmlRpc::XmlRpcValue::operator=(pXVar9,(XmlRpcValue *)uri_buf);
      XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)uri_buf);
      XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)uri_buf,&ops->service);
      pXVar9 = XmlRpc::XmlRpcValue::operator[](&args,1);
      XmlRpc::XmlRpcValue::operator=(pXVar9,(XmlRpcValue *)uri_buf);
      XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)uri_buf);
      psVar8 = network::getHost_abi_cxx11_();
      pcVar3 = (psVar8->_M_dataplus)._M_p;
      uVar6 = ConnectionManager::getTCPPort
                        ((this->connection_manager_).
                         super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      snprintf(uri_buf,0x400,"rosrpc://%s:%d",pcVar3,(ulong)uVar6);
      paVar2 = &local_498.field_2;
      local_498._M_dataplus._M_p = (pointer)paVar2;
      sVar10 = strlen(uri_buf);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,uri_buf,uri_buf + sVar10)
      ;
      XmlRpc::XmlRpcValue::XmlRpcValue(&local_448,&local_498);
      pXVar9 = XmlRpc::XmlRpcValue::operator[](&args,2);
      XmlRpc::XmlRpcValue::operator=(pXVar9,&local_448);
      XmlRpc::XmlRpcValue::invalidate(&local_448);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != paVar2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      XmlRpc::XmlRpcValue::XmlRpcValue
                ((XmlRpcValue *)&local_498,
                 &((this->xmlrpc_manager_).
                   super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->uri_
                );
      pXVar9 = XmlRpc::XmlRpcValue::operator[](&args,3);
      XmlRpc::XmlRpcValue::operator=(pXVar9,(XmlRpcValue *)&local_498);
      XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&local_498);
      this_00 = (this->master_link_).
                super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_498._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"registerService","");
      MasterLink::execute(this_00,&local_498,&args,&result,&payload,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != paVar2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      XmlRpc::XmlRpcValue::invalidate(&payload);
      XmlRpc::XmlRpcValue::invalidate(&result);
      XmlRpc::XmlRpcValue::invalidate(&args);
      bVar4 = true;
      goto LAB_001feec4;
    }
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (advertiseService::loc.initialized_ == false) {
      uri_buf._0_8_ = uri_buf + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)uri_buf,"miniros.service_manager","");
      console::initializeLogLocation(&advertiseService::loc,(string *)uri_buf,Error);
      if ((char *)uri_buf._0_8_ != uri_buf + 0x10) {
        operator_delete((void *)uri_buf._0_8_,uri_buf._16_8_ + 1);
      }
    }
    if (advertiseService::loc.level_ != Error) {
      console::setLogLocationLevel(&advertiseService::loc,Error);
      console::checkLogLocationEnabled(&advertiseService::loc);
    }
    if (advertiseService::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,advertiseService::loc.logger_,advertiseService::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_manager.cpp"
                     ,0x83,
                     "bool miniros::ServiceManager::advertiseService(const AdvertiseServiceOptions &)"
                     ,"Tried to advertise a service that is already advertised in this node [%s]",
                     (ops->service)._M_dataplus._M_p);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  bVar4 = false;
LAB_001feec4:
  pthread_mutex_unlock((pthread_mutex_t *)&this->shutting_down_mutex_);
  return bVar4;
}

Assistant:

bool ServiceManager::advertiseService(const AdvertiseServiceOptions& ops)
{
  std::scoped_lock<std::recursive_mutex> shutdown_lock(shutting_down_mutex_);
  if (shutting_down_ || !master_link_)
  {
    return false;
  }

  {
    std::scoped_lock<std::mutex> lock(service_publications_mutex_);

    if (isServiceAdvertised(ops.service))
    {
      MINIROS_ERROR("Tried to advertise a service that is already advertised in this node [%s]", ops.service.c_str());
      return false;
    }

    ServicePublicationPtr pub = std::make_shared<ServicePublication>(ops.service, ops.md5sum, ops.datatype,
      ops.req_datatype, ops.res_datatype, ops.helper, ops.callback_queue, ops.tracked_object);
    service_publications_.push_back(pub);
  }

  XmlRpcValue args, result, payload;
  args[0] = this_node::getName();
  args[1] = ops.service;
  char uri_buf[1024];
  std::snprintf(uri_buf, sizeof(uri_buf), "rosrpc://%s:%d",
           network::getHost().c_str(), connection_manager_->getTCPPort());
  args[2] = string(uri_buf);
  args[3] = xmlrpc_manager_->getServerURI();
  master_link_->execute("registerService", args, result, payload, true);

  return true;
}